

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obstacle.cpp
# Opt level: O2

Obstacle * __thiscall Obstacle::operator=(Obstacle *this,Obstacle *src)

{
  int iVar1;
  
  if (this != src) {
    iVar1 = src->_ypos;
    this->_xpos = src->_xpos;
    this->_ypos = iVar1;
    this->_delay = src->_delay;
    this->_active = src->_active;
    iVar1 = src->_limit;
    this->_speed = src->_speed;
    this->_limit = iVar1;
    std::__cxx11::string::_M_assign((string *)&this->_axis);
    std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::operator=
              (&this->_cars,&src->_cars);
  }
  return this;
}

Assistant:

Obstacle& Obstacle::operator=(const Obstacle& src){
        if(this != &src){
            _xpos = src._xpos;
            _ypos = src._ypos;
            _delay = src._delay;
            _active = src._active;
            _speed = src._speed;
            _limit = src._limit;
            _axis = src._axis;
           _cars = src._cars;
       
        }

        return *this;
    }